

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocs_test.cc
# Opt level: O0

int test_describe_monitor_items(void)

{
  code *pcVar1;
  char *__s;
  OcsDescribeMonitorItemsRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_181;
  int ret;
  HttpTestListener *local_160;
  HttpTestListener *listener;
  string local_150;
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [55];
  allocator<char> local_c9;
  string local_c8 [32];
  OcsDescribeMonitorItemsRequestType *local_a8;
  Ocs *ocs;
  OcsDescribeMonitorItemsResponseType resp;
  OcsDescribeMonitorItemsRequestType req;
  
  aliyun::OcsDescribeMonitorItemsRequestType::OcsDescribeMonitorItemsRequestType
            ((OcsDescribeMonitorItemsRequestType *)
             &resp.monitor_items.
              super__Vector_base<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType,_std::allocator<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  aliyun::OcsDescribeMonitorItemsResponseType::OcsDescribeMonitorItemsResponseType
            ((OcsDescribeMonitorItemsResponseType *)&ocs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"cn-hangzhou",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"my_appid",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"my_secret",&local_129);
  pOVar2 = (OcsDescribeMonitorItemsRequestType *)
           aliyun::Ocs::CreateOcsClient(local_c8,local_100,local_128);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  local_a8 = pOVar2;
  if (pOVar2 == (OcsDescribeMonitorItemsRequestType *)0x0) {
    aliyun::OcsDescribeMonitorItemsResponseType::~OcsDescribeMonitorItemsResponseType
              ((OcsDescribeMonitorItemsResponseType *)&ocs);
    aliyun::OcsDescribeMonitorItemsRequestType::~OcsDescribeMonitorItemsRequestType
              ((OcsDescribeMonitorItemsRequestType *)
               &resp.monitor_items.
                super__Vector_base<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType,_std::allocator<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ocs::SetProxyHost((Ocs *)pOVar2,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ocs::SetUseTls((Ocs *)local_a8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_describe_monitor_items_response;
  local_160 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_181);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_181);
  HttpTestListener::Start(local_160);
  std::__cxx11::string::operator=
            ((string *)
             &resp.monitor_items.
              super__Vector_base<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType,_std::allocator<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::Ocs::DescribeMonitorItems
            (local_a8,(OcsDescribeMonitorItemsResponseType *)
                      &resp.monitor_items.
                       super__Vector_base<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType,_std::allocator<aliyun::OcsDescribeMonitorItemsOcsMonitorItemType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(OcsErrorInfo *)&ocs);
  HttpTestListener::WaitComplete(local_160);
  pHVar3 = local_160;
  if (local_160 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_160);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_a8;
  if (local_a8 != (OcsDescribeMonitorItemsRequestType *)0x0) {
    aliyun::Ocs::~Ocs((Ocs *)local_a8);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_describe_monitor_items() {
  OcsDescribeMonitorItemsRequestType req;
  OcsDescribeMonitorItemsResponseType resp;
  Ocs* ocs = Ocs::CreateOcsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ocs) return 0;
  ocs->SetProxyHost("127.0.0.1:12234");
  ocs->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_describe_monitor_items_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  int ret = ocs->DescribeMonitorItems(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ocs;
}